

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddSDESNormalItem
          (RTCPCompoundPacketBuilder *this,ItemType t,void *itemdata,uint8_t itemlength)

{
  ulong len;
  size_t sVar1;
  size_t sVar2;
  RTPMemoryManager *pRVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint8_t *buf;
  
  iVar4 = -0x2a;
  if (this->arebuilding == true) {
    if ((this->sdes).sdessources.
        super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
        ._M_impl._M_node.super__List_node_base._M_next ==
        (_List_node_base *)&(this->sdes).sdessources) {
      iVar4 = -0x28;
    }
    else {
      iVar4 = -0x26;
      if (t - CNAME < 7) {
        sVar1 = this->appsize;
        sVar2 = this->byesize;
        sVar5 = Report::NeededBytes(&this->report);
        sVar6 = SDES::NeededBytesWithExtraItem(&this->sdes,itemlength);
        iVar4 = -0x2b;
        if (sVar6 + sVar5 + sVar1 + sVar2 <= this->maximumpacketsize) {
          len = (ulong)itemlength + 2;
          pRVar3 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
          if (pRVar3 == (RTPMemoryManager *)0x0) {
            buf = (uint8_t *)operator_new__(len);
          }
          else {
            buf = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,len,7);
            if (buf == (uint8_t *)0x0) {
              return -1;
            }
          }
          *buf = (char)(t - CNAME) + '\x01';
          buf[1] = itemlength;
          if (itemlength != '\0') {
            memcpy(buf + 2,itemdata,(ulong)itemlength);
          }
          SDES::AddItem(&this->sdes,buf,len);
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int RTCPCompoundPacketBuilder::AddSDESNormalItem(RTCPSDESPacket::ItemType t,const void *itemdata,uint8_t itemlength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (sdes.sdessources.empty())
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;

	uint8_t itemid;
	
	switch(t)
	{
	case RTCPSDESPacket::CNAME:
		itemid = RTCP_SDES_ID_CNAME;
		break;
	case RTCPSDESPacket::NAME:
		itemid = RTCP_SDES_ID_NAME;
		break;
	case RTCPSDESPacket::EMAIL:
		itemid = RTCP_SDES_ID_EMAIL;
		break;
	case RTCPSDESPacket::PHONE:
		itemid = RTCP_SDES_ID_PHONE;
		break;
	case RTCPSDESPacket::LOC:
		itemid = RTCP_SDES_ID_LOCATION;
		break;
	case RTCPSDESPacket::TOOL:
		itemid = RTCP_SDES_ID_TOOL;
		break;
	case RTCPSDESPacket::NOTE:
		itemid = RTCP_SDES_ID_NOTE;
		break;
	default:
		return ERR_RTP_RTCPCOMPPACKBUILDER_INVALIDITEMTYPE;
	}

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = byesize+appsize+report.NeededBytes();
#else
	size_t totalotherbytes = byesize+appsize+unknownsize+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sdessizewithextraitem = sdes.NeededBytesWithExtraItem(itemlength);

	if ((sdessizewithextraitem+totalotherbytes) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t len;

	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPSDESBLOCK) uint8_t[sizeof(RTCPSDESHeader)+(size_t)itemlength];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	len = sizeof(RTCPSDESHeader)+(size_t)itemlength;

	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(buf);

	sdeshdr->sdesid = itemid;
	sdeshdr->length = itemlength;
	if (itemlength != 0)
		memcpy((buf + sizeof(RTCPSDESHeader)),itemdata,(size_t)itemlength);

	sdes.AddItem(buf,len);
	return 0;
}